

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_test.cpp
# Opt level: O2

void __thiscall raw_test::on_end_of_content(raw_test *this)

{
  bool bVar1;
  test_data *ptVar2;
  ostream *poVar3;
  allocator local_59;
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ptVar2 = data(this);
  ptVar2->on_end_of_content = ptVar2->on_end_of_content + 1;
  cppcms::application::request();
  std::__cxx11::string::string(local_58,"fail",&local_59);
  cppcms::http::request::get((string *)&local_38);
  bVar1 = std::operator==(&local_38,"");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string(local_58);
  if (bVar1) {
    cppcms::application::request();
    std::__cxx11::string::string(local_58,"abort",&local_59);
    cppcms::http::request::get((string *)&local_38);
    bVar1 = std::operator==(&local_38,"on_end_of_content");
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string(local_58);
    if (bVar1) {
      basic_test::do_abort(&this->super_basic_test,0x1f7);
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"FAIL: request().get(\"fail\")==\"\" in line: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xf4);
    std::endl<char,std::char_traits<char>>(poVar3);
    g_fail = 1;
  }
  return;
}

Assistant:

void on_end_of_content(){
		data()->on_end_of_content++;
		TESTNT(request().get("fail")=="");
		if(request().get("abort")=="on_end_of_content")
			do_abort(503);

	}